

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O1

bool __thiscall cmake::SetDirectoriesFromFile(cmake *this,string *arg)

{
  cmState *this_00;
  size_type sVar1;
  size_type sVar2;
  _Alloc_hider _Var3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  cmValue dir;
  string *psVar8;
  size_type __rlen;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  string fullPath;
  string path;
  string cacheFile;
  string listPath;
  string cachePath;
  string listFile;
  string local_108;
  char *local_e8;
  undefined8 local_e0;
  string local_d8;
  string *local_b8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_b8 = arg;
  bVar4 = cmsys::SystemTools::FileIsDirectory(arg);
  if (bVar4) {
    cmsys::SystemTools::CollapseFullPath(&local_d8,local_b8);
    cmsys::SystemTools::ConvertToUnixSlashes(&local_d8);
    local_108._M_dataplus._M_p = (pointer)local_d8._M_string_length;
    local_108._M_string_length = (size_type)local_d8._M_dataplus._M_p;
    local_108.field_2._M_allocated_capacity = 0;
    local_108.field_2._8_8_ = 0xf;
    local_e8 = "/CMakeCache.txt";
    local_e0 = 0;
    views._M_len = 2;
    views._M_array = (iterator)&local_108;
    cmCatViews(&local_b0,views);
    local_108._M_dataplus._M_p = (pointer)local_d8._M_string_length;
    local_108._M_string_length = (size_type)local_d8._M_dataplus._M_p;
    local_108.field_2._M_allocated_capacity = 0;
    local_108.field_2._8_8_ = 0xf;
    local_e8 = "/CMakeLists.txt";
    local_e0 = 0;
    views_00._M_len = 2;
    views_00._M_array = (iterator)&local_108;
    cmCatViews(&local_50,views_00);
    bVar4 = cmsys::SystemTools::FileExists(&local_b0);
    if (bVar4) {
      std::__cxx11::string::_M_assign((string *)&local_70);
    }
    bVar5 = cmsys::SystemTools::FileExists(&local_50);
    if (bVar5) {
      bVar4 = true;
      std::__cxx11::string::_M_assign((string *)&local_90);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar4 = cmsys::SystemTools::FileExists(local_b8);
    if (bVar4) {
      cmsys::SystemTools::CollapseFullPath(&local_108,local_b8);
      cmsys::SystemTools::GetFilenameName(&local_d8,&local_108);
      cmsys::SystemTools::LowerCase(&local_b0,&local_d8);
      std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      _Var3._M_p = local_d8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_string_length ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0xe) {
        iVar7 = bcmp(local_d8._M_dataplus._M_p,"cmakecache.txt",0xe);
        if (iVar7 == 0) {
          cmsys::SystemTools::GetFilenamePath(&local_b0,&local_108);
          psVar8 = &local_70;
          goto LAB_0030b3d9;
        }
        iVar7 = bcmp(_Var3._M_p,"cmakelists.txt",0xe);
        if (iVar7 == 0) {
          cmsys::SystemTools::GetFilenamePath(&local_b0,&local_108);
          goto LAB_0030b3bd;
        }
      }
    }
    else {
      cmsys::SystemTools::CollapseFullPath(&local_108,local_b8);
      cmsys::SystemTools::GetFilenameName(&local_d8,&local_108);
      cmsys::SystemTools::LowerCase(&local_b0,&local_d8);
      std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      _Var3._M_p = local_d8._M_dataplus._M_p;
      if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_d8._M_string_length ==
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0xe) &&
         ((iVar7 = bcmp(local_d8._M_dataplus._M_p,"cmakecache.txt",0xe), iVar7 == 0 ||
          (iVar7 = bcmp(_Var3._M_p,"cmakelists.txt",0xe), iVar7 == 0)))) {
        cmsys::SystemTools::GetFilenamePath(&local_b0,&local_108);
LAB_0030b3bd:
        psVar8 = &local_90;
LAB_0030b3d9:
        std::__cxx11::string::operator=((string *)psVar8,(string *)&local_b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        std::__cxx11::string::_M_assign((string *)&local_90);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    bVar4 = true;
    bVar5 = false;
  }
  if ((local_70._M_string_length != 0) && (bVar6 = LoadCache(this,&local_70), bVar6)) {
    this_00 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
              super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
              super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"CMAKE_HOME_DIRECTORY","");
    dir = cmState::GetCacheEntryValue(this_00,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if (dir.Value != (string *)0x0) {
      SetHomeOutputDirectory(this,&local_70);
      bVar6 = true;
      SetHomeDirectory(this,dir.Value);
      goto LAB_0030b690;
    }
  }
  psVar8 = cmState::GetSourceDirectory_abi_cxx11_
                     ((this->State)._M_t.
                      super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                      super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                      super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
  sVar1 = psVar8->_M_string_length;
  psVar8 = cmState::GetBinaryDirectory_abi_cxx11_
                     ((this->State)._M_t.
                      super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                      super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                      super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
  sVar2 = psVar8->_M_string_length;
  psVar8 = cmState::GetSourceDirectory_abi_cxx11_
                     ((this->State)._M_t.
                      super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                      super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                      super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
  if (((local_90._M_string_length != psVar8->_M_string_length) ||
      ((bVar6 = true, local_90._M_string_length != 0 &&
       (iVar7 = bcmp(local_90._M_dataplus._M_p,(psVar8->_M_dataplus)._M_p,local_90._M_string_length)
       , iVar7 != 0)))) &&
     ((psVar8 = cmState::GetBinaryDirectory_abi_cxx11_
                          ((this->State)._M_t.
                           super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                           super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                           super__Head_base<0UL,_cmState_*,_false>._M_head_impl),
      local_90._M_string_length != psVar8->_M_string_length ||
      ((bVar6 = true, local_90._M_string_length != 0 &&
       (iVar7 = bcmp(local_90._M_dataplus._M_p,(psVar8->_M_dataplus)._M_p,local_90._M_string_length)
       , iVar7 != 0)))))) {
    bVar6 = (bool)(sVar2 == 0 | bVar5);
  }
  if (local_90._M_string_length == 0) {
    if (sVar1 == 0) {
      cmsys::SystemTools::CollapseFullPath(&local_108,local_b8);
      SetHomeDirectory(this,&local_108);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
    }
    if ((sVar1 == 0) || (bVar4 != false || sVar2 != 0)) {
      if (sVar2 == 0) {
        cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
        SetHomeOutputDirectory(this,&local_108);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
        }
        bVar6 = false;
      }
      goto LAB_0030b690;
    }
    cmsys::SystemTools::CollapseFullPath(&local_108,local_b8);
    SetHomeOutputDirectory(this,&local_108);
  }
  else if (bVar5 == false) {
    if (sVar1 != 0 || sVar2 != 0) {
      if (sVar2 == 0) {
        SetHomeOutputDirectory(this,&local_90);
      }
      goto LAB_0030b690;
    }
    SetHomeDirectory(this,&local_90);
    cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
    SetHomeOutputDirectory(this,&local_108);
  }
  else {
    SetHomeDirectoryViaCommandLine(this,&local_90);
    if (sVar2 != 0) goto LAB_0030b690;
    cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
    SetHomeOutputDirectory(this,&local_108);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
LAB_0030b690:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  return bVar6;
}

Assistant:

bool cmake::SetDirectoriesFromFile(const std::string& arg)
{
  // Check if the argument refers to a CMakeCache.txt or
  // CMakeLists.txt file.
  std::string listPath;
  std::string cachePath;
  bool is_source_dir = false;
  bool is_empty_directory = false;
  if (cmSystemTools::FileIsDirectory(arg)) {
    std::string path = cmSystemTools::CollapseFullPath(arg);
    cmSystemTools::ConvertToUnixSlashes(path);
    std::string cacheFile = cmStrCat(path, "/CMakeCache.txt");
    std::string listFile = cmStrCat(path, "/CMakeLists.txt");

    is_empty_directory = true;
    if (cmSystemTools::FileExists(cacheFile)) {
      cachePath = path;
      is_empty_directory = false;
    }
    if (cmSystemTools::FileExists(listFile)) {
      listPath = path;
      is_empty_directory = false;
      is_source_dir = true;
    }
  } else if (cmSystemTools::FileExists(arg)) {
    std::string fullPath = cmSystemTools::CollapseFullPath(arg);
    std::string name = cmSystemTools::GetFilenameName(fullPath);
    name = cmSystemTools::LowerCase(name);
    if (name == "cmakecache.txt"_s) {
      cachePath = cmSystemTools::GetFilenamePath(fullPath);
    } else if (name == "cmakelists.txt"_s) {
      listPath = cmSystemTools::GetFilenamePath(fullPath);
    }
  } else {
    // Specified file or directory does not exist.  Try to set things
    // up to produce a meaningful error message.
    std::string fullPath = cmSystemTools::CollapseFullPath(arg);
    std::string name = cmSystemTools::GetFilenameName(fullPath);
    name = cmSystemTools::LowerCase(name);
    if (name == "cmakecache.txt"_s || name == "cmakelists.txt"_s) {
      listPath = cmSystemTools::GetFilenamePath(fullPath);
    } else {
      listPath = fullPath;
    }
  }

  // If there is a CMakeCache.txt file, use its settings.
  if (!cachePath.empty()) {
    if (this->LoadCache(cachePath)) {
      cmValue existingValue =
        this->State->GetCacheEntryValue("CMAKE_HOME_DIRECTORY");
      if (existingValue) {
        this->SetHomeOutputDirectory(cachePath);
        this->SetHomeDirectory(*existingValue);
        return true;
      }
    }
  }

  bool no_source_tree = this->GetHomeDirectory().empty();
  bool no_build_tree = this->GetHomeOutputDirectory().empty();

  // When invoked with a path that points to an existing CMakeCache
  // This function is called multiple times with the same path
  const bool passed_same_path = (listPath == this->GetHomeDirectory()) ||
    (listPath == this->GetHomeOutputDirectory());
  bool used_provided_path =
    (passed_same_path || is_source_dir || no_build_tree);

  // If there is a CMakeLists.txt file, use it as the source tree.
  if (!listPath.empty()) {
    // When invoked with a path that points to an existing CMakeCache
    // This function is called multiple times with the same path
    if (is_source_dir) {
      this->SetHomeDirectoryViaCommandLine(listPath);
      if (no_build_tree) {
        std::string cwd = cmSystemTools::GetCurrentWorkingDirectory();
        this->SetHomeOutputDirectory(cwd);
      }
    } else if (no_source_tree && no_build_tree) {
      this->SetHomeDirectory(listPath);

      std::string cwd = cmSystemTools::GetCurrentWorkingDirectory();
      this->SetHomeOutputDirectory(cwd);
    } else if (no_build_tree) {
      this->SetHomeOutputDirectory(listPath);
    }
  } else {
    if (no_source_tree) {
      // We didn't find a CMakeLists.txt and it wasn't specified
      // with -S. Assume it is the path to the source tree
      std::string full = cmSystemTools::CollapseFullPath(arg);
      this->SetHomeDirectory(full);
    }
    if (no_build_tree && !no_source_tree && is_empty_directory) {
      // passed `-S <path> <build_dir> when build_dir is an empty directory
      std::string full = cmSystemTools::CollapseFullPath(arg);
      this->SetHomeOutputDirectory(full);
    } else if (no_build_tree) {
      // We didn't find a CMakeCache.txt and it wasn't specified
      // with -B. Assume the current working directory as the build tree.
      std::string cwd = cmSystemTools::GetCurrentWorkingDirectory();
      this->SetHomeOutputDirectory(cwd);
      used_provided_path = false;
    }
  }

  return used_provided_path;
}